

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_CommandLogging.cpp
# Opt level: O2

void __thiscall
RenX_CommandLoggingPlugin::WriteToLog
          (RenX_CommandLoggingPlugin *this,Server *server,PlayerInfo *player,string_view message)

{
  char cVar1;
  ushort uVar2;
  string *psVar3;
  char *pcVar4;
  ostream *poVar5;
  string local_50;
  
  PrepFile(this);
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 != '\0') {
    psVar3 = (string *)RenX::Server::getSocketHostname_abi_cxx11_();
    uVar2 = RenX::Server::getSocketPort();
    pcVar4 = (char *)getTimeFormat("%T");
    poVar5 = std::operator<<((ostream *)&this->field_0xd0,pcVar4);
    poVar5 = std::operator<<(poVar5," ");
    poVar5 = std::operator<<(poVar5,psVar3);
    poVar5 = std::operator<<(poVar5,":");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,uVar2);
    poVar5 = std::operator<<(poVar5," ");
    std::__cxx11::to_string(&local_50,player->access);
    poVar5 = std::operator<<(poVar5,(string *)&local_50);
    poVar5 = std::operator<<(poVar5," ");
    poVar5 = std::operator<<(poVar5,(string *)&player->name);
    poVar5 = std::operator<<(poVar5,": ");
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar5,message._M_str,message._M_len);
    std::endl<char,std::char_traits<char>>(poVar5);
    std::__cxx11::string::~string((string *)&local_50);
  }
  return;
}

Assistant:

void RenX_CommandLoggingPlugin::WriteToLog(RenX::Server& server, const RenX::PlayerInfo& player, std::string_view  message) {
	// Check if new file needs to be opened
	PrepFile();

	if (!fs.is_open()) {
		return;
	}

	const std::string& serverHostname = server.getSocketHostname();
	unsigned short serverPort = server.getSocketPort();

	fs << getTimeFormat("%T")
		<< " "
		<< serverHostname
		<< ":"
		<< serverPort
		<< " "
		<< std::to_string(player.access)
		<< " "
		<< player.name
		<< ": "
		<< message
		<< std::endl;
}